

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_sparse.cpp
# Opt level: O0

iterator_element * __thiscall
Disa::Matrix_Sparse::erase
          (iterator_element *__return_storage_ptr__,Matrix_Sparse *this,
          Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse> *iter_element)

{
  Matrix_Sparse *this_00;
  Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse> *this_01;
  bool bVar1;
  pointer this_02;
  size_t *i_column;
  ostream *poVar2;
  size_t *psVar3;
  reference __first;
  Scalar *__last;
  reference puVar4;
  reference value;
  undefined8 in_RCX;
  source_location *location;
  bool local_1a9;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_190;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_188;
  const_iterator local_180;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_178;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_170;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_168;
  const_iterator local_160;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_158;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> local_150;
  difference_type local_148;
  difference_type distance;
  __unspec local_131;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_130;
  type_conflict1 local_121;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_120;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_118;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  non_zeros;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  undefined **local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  undefined1 local_78 [48];
  undefined1 local_48 [48];
  Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse> *local_18;
  Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse> *iter_element_local;
  Matrix_Sparse *this_local;
  
  local_18 = iter_element;
  iter_element_local = (Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse> *)this;
  end((Matrix_Sparse *)local_48);
  this_02 = Iterator_Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator-><Disa::Matrix_Sparse,_true>
                      ((Iterator_Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_48);
  Matrix_Sparse_Row<Disa::Matrix_Sparse>::end((iterator *)(local_48 + 0x10),this_02);
  bVar1 = Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>::operator!=
                    (iter_element,
                     (Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse> *)(local_48 + 0x10));
  this_01 = local_18;
  location = (source_location *)CONCAT71((int7)((ulong)in_RCX >> 8),bVar1);
  local_1a9 = false;
  if (bVar1) {
    Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>::i_row(local_18);
    operator[]((Matrix_Sparse *)local_78,(size_t *)this);
    Matrix_Sparse_Row<Disa::Matrix_Sparse>::end
              ((iterator *)(local_78 + 0x10),(Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_78);
    bVar1 = Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>::operator!=
                      (this_01,(Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse> *)
                               (local_78 + 0x10));
    location = (source_location *)CONCAT71((int7)((ulong)location >> 8),bVar1);
    local_1a9 = false;
    if (bVar1) {
      psVar3 = Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>::i_row(local_18);
      i_column = Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>::i_column(local_18);
      local_1a9 = contains(this,psVar3,i_column);
    }
  }
  if (((local_1a9 ^ 0xffU) & 1) != 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"\n");
    local_a0 = &PTR_s__workspace_llm4binary_github_lic_001f6b78;
    console_format_abi_cxx11_(&local_98,(Disa *)0x0,(Log_Level)&local_a0,location);
    poVar2 = std::operator<<(poVar2,(string *)&local_98);
    psVar3 = Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>::i_row(local_18);
    this_00 = (Matrix_Sparse *)*psVar3;
    psVar3 = Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>::i_column(local_18);
    row_column_abi_cxx11_((string *)&non_zeros,this_00,*psVar3,(size_t)location);
    std::operator+(&local_f0,"Entry [",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&non_zeros);
    std::operator+(&local_d0,&local_f0,"] does not exist.");
    poVar2 = std::operator<<(poVar2,(string *)&local_d0);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&non_zeros);
    std::__cxx11::string::~string((string *)&local_98);
    exit(1);
  }
  local_120._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(&this->row_non_zero);
  psVar3 = Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>::i_row(local_18);
  local_118 = std::
              next<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                        (local_120,*psVar3 + 1);
  while( true ) {
    local_130._M_current =
         (unsigned_long *)
         std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(&this->row_non_zero);
    local_121 = (type_conflict1)
                __gnu_cxx::
                operator<=><unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>
                          (&local_118,&local_130);
    std::__cmp_cat::__unspec::__unspec(&local_131,(__unspec *)0x0);
    bVar1 = std::operator<(local_121);
    if (!bVar1) break;
    distance = (difference_type)
               __gnu_cxx::
               __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator++(&local_118,0);
    puVar4 = __gnu_cxx::
             __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             ::operator*((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          *)&distance);
    *puVar4 = *puVar4 - 1;
  }
  local_150._M_current =
       (double *)std::vector<double,_std::allocator<double>_>::cbegin(&this->element_value);
  __first = __gnu_cxx::
            __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
            operator*(&local_150);
  __last = Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>::operator*(local_18);
  local_148 = std::distance<double_const*>(__first,__last);
  psVar3 = Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>::i_row(local_18);
  local_170._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(&this->column_index);
  local_168 = __gnu_cxx::
              __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              ::operator+(&local_170,local_148);
  __gnu_cxx::
  __normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>::
  __normal_iterator<unsigned_long*>
            ((__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>
              *)&local_160,&local_168);
  local_158._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::erase
                 (&this->column_index,local_160);
  puVar4 = __gnu_cxx::
           __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
           ::operator*(&local_158);
  local_190._M_current =
       (double *)std::vector<double,_std::allocator<double>_>::begin(&this->element_value);
  local_188 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
              ::operator+(&local_190,local_148);
  __gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>::
  __normal_iterator<double*>
            ((__normal_iterator<double_const*,std::vector<double,std::allocator<double>>> *)
             &local_180,&local_188);
  local_178._M_current =
       (double *)std::vector<double,_std::allocator<double>_>::erase(&this->element_value,local_180)
  ;
  value = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
          operator*(&local_178);
  Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>::Iterator_Matrix_Sparse_Element
            (__return_storage_ptr__,this,psVar3,puVar4,value);
  return __return_storage_ptr__;
}

Assistant:

Matrix_Sparse::iterator_element Matrix_Sparse::erase(
const Iterator_Matrix_Sparse_Element<Matrix_Sparse>& iter_element) {
  ASSERT_DEBUG(iter_element != end()->end() && iter_element != (*this)[iter_element.i_row()].end() &&
               contains(iter_element.i_row(), iter_element.i_column()),
               "Entry [" + row_column(iter_element.i_row(), iter_element.i_column()) + "] does not exist.");
  for(auto non_zeros = std::next(row_non_zero.begin(), static_cast<s_size_t>(iter_element.i_row() + 1));
      non_zeros < row_non_zero.end(); --(*non_zeros++))
    ;
  const auto distance = std::distance(&*element_value.cbegin(), &*iter_element);
  return {this, iter_element.i_row(), &*(column_index.erase(column_index.begin() + distance)),
          &*(element_value.erase(element_value.begin() + distance))};
}